

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::splitsliver(tetgenmesh *this,triface *slitet,double cosd,int chkencflag)

{
  tetrahedron *pppdVar1;
  uint *puVar2;
  arraypool *paVar3;
  memorypool *pmVar4;
  long *plVar5;
  int iVar6;
  char *pcVar7;
  tetrahedron *pppdVar8;
  long *plVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  tetrahedron *pppdVar15;
  optparameters opm;
  double smtpt [3];
  point steinerpt;
  insertvertexflags ivf;
  triface local_130;
  int local_11c;
  optparameters local_118;
  long local_e0;
  double local_d8;
  long *local_d0;
  double local_c8 [3];
  point local_b0;
  insertvertexflags local_a8;
  
  iVar14 = 0;
  local_130.tet = (tetrahedron *)0x0;
  local_130.ver = 0;
  local_118.max_min_volume = 0;
  local_118.min_max_aspectratio = 0;
  local_118.min_max_dihedangle = 0;
  local_118.initval = 0.0;
  local_118.imprval = 0.0;
  local_118.numofsearchdirs = 10;
  local_118.searchstep = 0.01;
  local_118.maxiter = -1;
  local_118.smthiter = 0;
  local_a8.refinetet.ver = 0;
  local_a8.refinesh.shver = 0;
  local_a8.refinetet.tet = (tetrahedron *)0x0;
  local_a8.refinesh.sh = (shellface *)0x0;
  local_a8.smlenflag = 0;
  local_a8.smlen = 0.0;
  local_a8.iloc = 0;
  local_a8.bowywat = 0;
  local_a8.lawson = 0;
  local_a8.splitbdflag = 0;
  local_a8.validflag = 0;
  local_a8.respectbdflag = 0;
  local_a8.rejflag = 0;
  local_a8.chkencflag = 0;
  local_a8.cdtflag = 0;
  local_a8.assignmeshsize = 0;
  local_a8.sloc = 0;
  local_a8.sbowywat = 0;
  local_a8.refineflag = 0;
  pppdVar15 = slitet->tet;
  iVar6 = edestoppotbl[slitet->ver];
  if ((pppdVar15[8] == (tetrahedron)0x0) || (pppdVar15[8][ver2edge[iVar6]] == (double *)0x0)) {
    iVar14 = 0;
    lVar13 = 0;
    lVar10 = 0;
    pppdVar8 = pppdVar15;
    iVar11 = iVar6;
    do {
      if (pppdVar8[7] == (tetrahedron)this->dummypoint) {
        return 0;
      }
      pppdVar1 = pppdVar8 + facepivot1[iVar11];
      pppdVar8 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      iVar11 = facepivot2[iVar11][(uint)*pppdVar1 & 0xf];
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + -0x10;
    } while (pppdVar15 != pppdVar8);
    if (pppdVar8[7] != (tetrahedron)this->dummypoint) {
      local_11c = chkencflag;
      local_d8 = cosd;
      local_d0 = (long *)operator_new__(-lVar13);
      plVar9 = local_d0;
      do {
        *plVar9 = 0;
        *(undefined4 *)(plVar9 + 1) = 0;
        plVar9 = plVar9 + 2;
      } while ((long *)((long)local_d0 - lVar13) != plVar9);
      plVar9 = local_d0 + 1;
      lVar13 = lVar10;
      do {
        plVar9[-1] = (long)pppdVar15;
        *(int *)plVar9 = iVar6;
        pppdVar8 = pppdVar15 + facepivot1[iVar6];
        pppdVar15 = (tetrahedron *)((ulong)*pppdVar8 & 0xfffffffffffffff0);
        iVar6 = facepivot2[iVar6][(uint)*pppdVar8 & 0xf];
        plVar9 = plVar9 + 2;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      plVar9 = local_d0 + 1;
      local_e0 = lVar10;
      do {
        lVar13 = plVar9[-1];
        iVar6 = esymtbl[eprevtbl[(int)*plVar9]];
        paVar3 = this->cavetetlist;
        pcVar7 = arraypool::getblock(paVar3,(int)paVar3->objects);
        lVar12 = (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & paVar3->objects);
        paVar3->objects = paVar3->objects + 1;
        *(long *)(pcVar7 + lVar12) = lVar13;
        *(int *)(pcVar7 + lVar12 + 8) = iVar6;
        pppdVar15 = (tetrahedron *)plVar9[-1];
        iVar6 = esymtbl[enexttbl[(int)*plVar9]];
        paVar3 = this->cavetetlist;
        pcVar7 = arraypool::getblock(paVar3,(int)paVar3->objects);
        plVar5 = local_d0;
        lVar13 = (long)paVar3->objectbytes * ((long)paVar3->objectsperblock - 1U & paVar3->objects);
        paVar3->objects = paVar3->objects + 1;
        *(tetrahedron **)(pcVar7 + lVar13) = pppdVar15;
        *(int *)(pcVar7 + lVar13 + 8) = iVar6;
        plVar9 = plVar9 + 2;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
      lVar10 = *(long *)(*local_d0 + (long)orgpivot[(int)local_d0[1]] * 8);
      lVar13 = *(long *)(*local_d0 + (long)destpivot[(int)local_d0[1]] * 8);
      lVar12 = 0;
      do {
        local_c8[lVar12] =
             (*(double *)(lVar10 + lVar12 * 8) + *(double *)(lVar13 + lVar12 * 8)) * 0.5;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_118.min_max_dihedangle = 1;
      local_118.initval = local_d8 + 1.0;
      local_118.numofsearchdirs = 0x14;
      local_118.searchstep = 0.001;
      local_118.maxiter = 100;
      local_130.tet = pppdVar15;
      local_130.ver = iVar6;
      iVar6 = smoothpoint(this,local_c8,this->cavetetlist,1,&local_118);
      lVar10 = local_e0;
      if (iVar6 == 0) {
        this->cavetetlist->objects = 0;
        operator_delete__(plVar5);
        iVar14 = 0;
      }
      else {
        if (local_118.smthiter == local_118.maxiter) {
          do {
            local_118.searchstep = local_118.searchstep * 10.0;
            local_118.initval = local_118.imprval;
            local_118.smthiter = 0;
            smoothpoint(this,local_c8,this->cavetetlist,1,&local_118);
          } while (local_118.smthiter == local_118.maxiter);
        }
        this->cavetetlist->objects = 0;
        makepoint(this,&local_b0,FREEVOLVERTEX);
        local_b0[2] = local_c8[2];
        *local_b0 = local_c8[0];
        local_b0[1] = local_c8[1];
        plVar9 = plVar5;
        do {
          puVar2 = (uint *)(*plVar9 + (long)this->elemmarkerindex * 4);
          *puVar2 = *puVar2 | 1;
          paVar3 = this->caveoldtetlist;
          pcVar7 = arraypool::getblock(paVar3,(int)paVar3->objects);
          lVar13 = (long)paVar3->objectbytes *
                   ((long)paVar3->objectsperblock - 1U & paVar3->objects);
          paVar3->objects = paVar3->objects + 1;
          *(long *)(pcVar7 + lVar13) = *plVar9;
          *(int *)(pcVar7 + lVar13 + 8) = (int)plVar9[1];
          plVar9 = plVar9 + 2;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        local_130.tet = (tetrahedron *)*plVar5;
        local_130.ver = (int)plVar5[1];
        if (this->b->metric != 0) {
          locate(this,local_b0,&local_130,0);
        }
        operator_delete__(plVar5);
        local_a8.iloc = 0xb;
        local_a8.chkencflag = local_11c;
        local_a8.assignmeshsize = this->b->metric;
        iVar14 = 0;
        iVar6 = insertpoint(this,local_b0,&local_130,(face *)0x0,(face *)0x0,&local_a8);
        if (iVar6 == 0) {
          *(uint *)((long)local_b0 + (long)this->pointmarkindex * 4 + 4) =
               *(byte *)((long)local_b0 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
          pmVar4 = this->points;
          *local_b0 = (double)pmVar4->deaditemstack;
          pmVar4->deaditemstack = local_b0;
          pmVar4->items = pmVar4->items + -1;
        }
        else {
          this->st_volref_count = this->st_volref_count + 1;
          iVar14 = 1;
          if (0 < this->steinerleft) {
            this->steinerleft = this->steinerleft + -1;
          }
        }
      }
    }
  }
  return iVar14;
}

Assistant:

int tetgenmesh::splitsliver(triface *slitet, REAL cosd, int chkencflag)
{
  triface *abtets;
  triface searchtet, spintet, *parytet;
  point pa, pb, steinerpt;
  optparameters opm;
  insertvertexflags ivf;
  REAL smtpt[3], midpt[3];
  int success;
  int t1ver;
  int n, i;

  // 'slitet' is [c,d,a,b], where [c,d] has a big dihedral angle. 
  // Go to the opposite edge [a,b].
  edestoppo(*slitet, searchtet); // [a,b,c,d].

  // Do not split a segment.
  if (issubseg(searchtet)) {
    return 0; 
  }

  // Count the number of tets shared at [a,b].
  // Do not split it if it is a hull edge.
  spintet = searchtet;
  n = 0; 
  while (1) {
    if (ishulltet(spintet)) break;
    n++;
    fnextself(spintet);
    if (spintet.tet == searchtet.tet) break;
  }
  if (ishulltet(spintet)) {
    return 0; // It is a hull edge.
  }

  // Get all tets at edge [a,b].
  abtets = new triface[n];
  spintet = searchtet;
  for (i = 0; i < n; i++) {
    abtets[i] = spintet;
    fnextself(spintet);
  }

  // Initialize the list of 2n boundary faces.
  for (i = 0; i < n; i++) {    
    eprev(abtets[i], searchtet);
    esymself(searchtet); // [a,p_i,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
    enext(abtets[i], searchtet);
    esymself(searchtet); // [p_i,b,p_i+1].
    cavetetlist->newindex((void **) &parytet);
    *parytet = searchtet;
  }

  // Init the Steiner point at the midpoint of edge [a,b].
  pa = org(abtets[0]);
  pb = dest(abtets[0]);
  for (i = 0; i < 3; i++) {
    smtpt[i] = midpt[i] = 0.5 * (pa[i] + pb[i]);
  }

  // Point smooth options.
  opm.min_max_dihedangle = 1;
  opm.initval = cosd + 1.0; // Initial volume is zero.
  opm.numofsearchdirs = 20;
  opm.searchstep = 0.001;  
  opm.maxiter = 100; // Limit the maximum iterations.

  success = smoothpoint(smtpt, cavetetlist, 1, &opm);

  if (success) {
    while (opm.smthiter == opm.maxiter) {
      // It was relocated and the prescribed maximum iteration reached. 
      // Try to increase the search stepsize.
      opm.searchstep *= 10.0;
      //opm.maxiter = 100; // Limit the maximum iterations.
      opm.initval = opm.imprval;
      opm.smthiter = 0; // Init.
      smoothpoint(smtpt, cavetetlist, 1, &opm);  
    }
  } // if (success)

  cavetetlist->restart();

  if (!success) {
    delete [] abtets;
    return 0;
  }


  // Insert the Steiner point.
  makepoint(&steinerpt, FREEVOLVERTEX);
  for (i = 0; i < 3; i++) steinerpt[i] = smtpt[i];

  // Insert the created Steiner point.
  for (i = 0; i < n; i++) {
    infect(abtets[i]);
    caveoldtetlist->newindex((void **) &parytet);
    *parytet = abtets[i];
  }

  searchtet = abtets[0]; // No need point location.
  if (b->metric) {
    locate(steinerpt, &searchtet); // For size interpolation.
  }

  delete [] abtets;

  ivf.iloc = (int) INSTAR;
  ivf.chkencflag = chkencflag;
  ivf.assignmeshsize = b->metric; 


  if (insertpoint(steinerpt, &searchtet, NULL, NULL, &ivf)) {
    // The vertex has been inserted.
    st_volref_count++; 
    if (steinerleft > 0) steinerleft--;
    return 1;
  } else {
    // The Steiner point is too close to an existing vertex. Reject it.
    pointdealloc(steinerpt);
    return 0;
  }
}